

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall
DSBarInfo::DrawGraphic
          (DSBarInfo *this,FTexture *texture,SBarInfoCoordinate x,SBarInfoCoordinate y,int xOffset,
          int yOffset,double Alpha,bool fullScreenOffsets,bool translate,bool dim,int offsetflags,
          bool alphaMap,int forceWidth,int forceHeight,double *clip,bool clearDontDraw)

{
  DFrameBuffer *pDVar1;
  FTexture *pFVar2;
  bool bVar3;
  bool relY;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  ulong in_stack_fffffffffffffc08;
  undefined4 uVar16;
  double *xScale_00;
  undefined8 in_stack_fffffffffffffc10;
  undefined4 uVar17;
  double *yScale_00;
  FRemapTable *local_368;
  FRemapTable *local_320;
  double local_2b0;
  double local_298;
  double local_280;
  double local_268;
  double local_260;
  double local_258;
  byte local_24b;
  byte local_249;
  int local_248;
  int local_244;
  FRemapTable *local_240;
  FRemapTable *local_1f8;
  double local_178;
  double local_168;
  double local_158;
  double local_148;
  double local_140;
  double local_138;
  int local_130;
  bool ybot;
  double dStack_e8;
  bool xright;
  double yScale;
  double xScale;
  double rcb;
  double rcr;
  double rcy;
  double rcx;
  double ry;
  double rx;
  double dcb;
  double dcr;
  double dcy;
  double dcx;
  double tmp;
  double h;
  double w;
  double dy;
  double dx;
  bool clearDontDraw_local;
  bool alphaMap_local;
  bool dim_local;
  bool translate_local;
  double dStack_58;
  bool fullScreenOffsets_local;
  double Alpha_local;
  int yOffset_local;
  int xOffset_local;
  FTexture *texture_local;
  DSBarInfo *this_local;
  SBarInfoCoordinate y_local;
  SBarInfoCoordinate x_local;
  
  uVar17 = (undefined4)((ulong)in_stack_fffffffffffffc10 >> 0x20);
  dx._7_1_ = fullScreenOffsets;
  dx._6_1_ = translate;
  dx._5_1_ = dim;
  dx._4_1_ = alphaMap;
  dx._3_1_ = clearDontDraw;
  if (texture != (FTexture *)0x0) {
    dStack_58 = Alpha;
    Alpha_local._0_4_ = yOffset;
    Alpha_local._4_4_ = xOffset;
    _yOffset_local = texture;
    texture_local = (FTexture *)this;
    this_local._0_4_ = y;
    this_local._4_4_ = x;
    iVar4 = SBarInfoCoordinate::operator*((SBarInfoCoordinate *)((long)&this_local + 4));
    dy = (double)iVar4;
    iVar4 = SBarInfoCoordinate::operator*((SBarInfoCoordinate *)&this_local);
    w = (double)iVar4;
    if ((offsetflags & 0x42U) == 0x42) {
      if (forceWidth < 0) {
        dVar10 = FTexture::GetScaledWidthDouble(_yOffset_local);
        dVar11 = FTexture::GetScaledLeftOffsetDouble(_yOffset_local);
        dy = dy - (dVar10 / 2.0 - dVar11);
      }
      else {
        dVar10 = FTexture::GetScaledLeftOffsetDouble(_yOffset_local);
        dVar11 = FTexture::GetScaledWidthDouble(_yOffset_local);
        dy = dy - (double)forceWidth * (0.5 - dVar10 / dVar11);
      }
      if (forceHeight < 0) {
        dVar10 = FTexture::GetScaledHeightDouble(_yOffset_local);
        dVar11 = FTexture::GetScaledTopOffsetDouble(_yOffset_local);
        w = w - (dVar10 / 2.0 - dVar11);
      }
      else {
        dVar10 = FTexture::GetScaledTopOffsetDouble(_yOffset_local);
        dVar11 = FTexture::GetScaledHeightDouble(_yOffset_local);
        w = w - (double)forceHeight * (0.5 - dVar10 / dVar11);
      }
    }
    dy = (double)Alpha_local._4_4_ + dy;
    w = (double)Alpha_local._0_4_ + w;
    if ((dx._7_1_ & 1) == 0) {
      dcx = 0.0;
      dy = (double)*(int *)&(this->super_DBaseStatusBar).super_DObject.field_0x24 + dy;
      if (((this->super_DBaseStatusBar).Scaled & 1U) == 0) {
        local_130 = 200;
      }
      else {
        local_130 = this->script->resH;
      }
      w = (double)(((this->super_DBaseStatusBar).ST_Y - local_130) + this->script->height) + w;
      if (forceWidth < 0) {
        local_138 = FTexture::GetScaledWidthDouble(_yOffset_local);
      }
      else {
        local_138 = (double)forceWidth;
      }
      h = local_138;
      if (forceHeight < 0) {
        local_140 = FTexture::GetScaledHeightDouble(_yOffset_local);
      }
      else {
        local_140 = (double)forceHeight;
      }
      tmp = local_140;
      if ((*clip != 0.0) || (NAN(*clip))) {
        local_148 = dy + *clip;
        dVar10 = FTexture::GetScaledLeftOffsetDouble(_yOffset_local);
        local_148 = local_148 - dVar10;
      }
      else {
        local_148 = 0.0;
      }
      dcy = local_148;
      if ((clip[1] != 0.0) || (NAN(clip[1]))) {
        local_158 = w + clip[1];
        dVar10 = FTexture::GetScaledTopOffsetDouble(_yOffset_local);
        local_158 = local_158 - dVar10;
      }
      else {
        local_158 = 0.0;
      }
      dcr = local_158;
      if ((clip[2] != 0.0) || (NAN(clip[2]))) {
        dVar11 = dy + h;
        dVar10 = clip[2];
        local_168 = FTexture::GetScaledLeftOffsetDouble(_yOffset_local);
        local_168 = (dVar11 - dVar10) - local_168;
      }
      else {
        local_168 = 2147483647.0;
      }
      dcb = local_168;
      if ((clip[3] != 0.0) || (NAN(clip[3]))) {
        dVar11 = w + tmp;
        dVar10 = clip[3];
        local_178 = FTexture::GetScaledTopOffsetDouble(_yOffset_local);
        local_178 = (dVar11 - dVar10) - local_178;
      }
      else {
        local_178 = 2147483647.0;
      }
      uVar16 = (undefined4)(in_stack_fffffffffffffc08 >> 0x20);
      rx = local_178;
      if (((this->super_DBaseStatusBar).Scaled & 1U) == 0) {
        w = (double)(200 - this->script->resH) + w;
        dcr = (double)(200 - this->script->resH) + dcr;
        rx = (double)(200 - this->script->resH) + local_178;
      }
      else {
        if ((((*clip != 0.0) || (NAN(*clip))) || (clip[1] != 0.0)) || (NAN(clip[1]))) {
          DCanvas::VirtualToRealCoords
                    ((DCanvas *)screen,&dcy,&dcr,&dcx,&dcx,(double)this->script->resW,
                     (double)this->script->resH,true,true);
          if ((*clip == 0.0) && (!NAN(*clip))) {
            dcy = 0.0;
          }
          if ((clip[1] == 0.0) && (!NAN(clip[1]))) {
            dcr = 0.0;
          }
        }
        if ((((clip[2] != 0.0) || (NAN(clip[2]))) || (clip[3] != 0.0)) ||
           ((NAN(clip[3]) || ((dx._3_1_ & 1) != 0)))) {
          DCanvas::VirtualToRealCoords
                    ((DCanvas *)screen,&dcb,&rx,&dcx,&dcx,(double)this->script->resW,
                     (double)this->script->resH,true,true);
        }
        in_stack_fffffffffffffc08 = CONCAT44(uVar16,1);
        DCanvas::VirtualToRealCoords
                  ((DCanvas *)screen,&dy,&w,&h,&tmp,(double)this->script->resW,
                   (double)this->script->resH,true,true);
      }
      pFVar2 = _yOffset_local;
      dVar13 = dy;
      dVar12 = w;
      dVar11 = h;
      dVar10 = tmp;
      pDVar1 = screen;
      uVar16 = (undefined4)(in_stack_fffffffffffffc08 >> 0x20);
      if ((dx._3_1_ & 1) == 0) {
        if ((dx._4_1_ & 1) == 0) {
          uVar5 = (uint)dcy;
          iVar4 = (int)dcr;
          dVar14 = MIN<double>(2147483647.0,dcb);
          dVar15 = MIN<double>(2147483647.0,rx);
          if ((dx._6_1_ & 1) == 0) {
            local_240 = (FRemapTable *)0x0;
          }
          else {
            local_240 = GetTranslation(this);
          }
          uVar9 = 0;
          if ((dx._5_1_ & 1) != 0) {
            uVar9 = 0xaa000000;
          }
          DCanvas::DrawTexture
                    ((DCanvas *)pDVar1,pFVar2,dVar13,dVar12,0x400013af,dVar11,dVar10,dStack_58,
                     0x400013b0,0x400013a3,(ulong)uVar5,CONCAT44(uVar16,0x400013a1),
                     CONCAT44(uVar17,iVar4),0x400013a4,(int)dVar14,0x400013a2,(int)dVar15,0x4000138e
                     ,local_240,0x400013aa,uVar9,0x4000139e,(uint)((offsetflags & 0x44U) == 0x44),
                     0x4000138c,0);
        }
        else {
          uVar5 = (uint)dcy;
          iVar4 = (int)dcr;
          dVar14 = MIN<double>(2147483647.0,dcb);
          dVar15 = MIN<double>(2147483647.0,rx);
          if ((dx._6_1_ & 1) == 0) {
            local_1f8 = (FRemapTable *)0x0;
          }
          else {
            local_1f8 = GetTranslation(this);
          }
          uVar9 = 0;
          if ((dx._5_1_ & 1) != 0) {
            uVar9 = 0xaa000000;
          }
          DCanvas::DrawTexture
                    ((DCanvas *)pDVar1,pFVar2,dVar13,dVar12,0x400013af,dVar11,dVar10,dStack_58,
                     0x400013b0,0x400013a3,(ulong)uVar5,CONCAT44(uVar16,0x400013a1),
                     CONCAT44(uVar17,iVar4),0x400013a4,(int)dVar14,0x400013a2,(int)dVar15,0x4000138e
                     ,local_1f8,0x400013aa,uVar9,0x4000139e,(uint)((offsetflags & 0x44U) == 0x44),
                     0x4000138c,0x4000138f,(uint)(dx._4_1_ & 1),0x4000138d,0,0);
        }
      }
      else {
        dVar12 = MAX<double>(dy,dcy);
        dVar13 = MAX<double>(w,dcr);
        dVar11 = h;
        dVar10 = dcb;
        dVar14 = MAX<double>(dy,dcy);
        dVar11 = MIN<double>(dVar10,dVar11 + dVar14);
        dVar10 = rx;
        dVar14 = MAX<double>(w,dcr);
        dVar10 = MIN<double>(dVar10,dVar14 + tmp);
        (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                  (pDVar1,(ulong)(uint)(int)dVar12,(ulong)(uint)(int)dVar13,(ulong)(uint)(int)dVar11
                   ,(ulong)(uint)(int)dVar10,(ulong)GPalette.BlackIndex,
                   in_stack_fffffffffffffc08 & 0xffffffff00000000);
      }
    }
    else {
      rcy = 0.0;
      rcr = 0.0;
      rcb = 2147483647.0;
      xScale = 2147483647.0;
      bVar3 = FBoolCVar::operator_cast_to_bool(&hud_scale);
      if (bVar3) {
        local_244 = this->script->cleanX;
      }
      else {
        local_244 = 1;
      }
      yScale = (double)local_244;
      bVar3 = FBoolCVar::operator_cast_to_bool(&hud_scale);
      if (bVar3) {
        local_248 = this->script->cleanY;
      }
      else {
        local_248 = 1;
      }
      dStack_e8 = (double)local_248;
      bVar3 = SBarInfoCoordinate::RelCenter((SBarInfoCoordinate *)((long)&this_local + 4));
      relY = SBarInfoCoordinate::RelCenter((SBarInfoCoordinate *)&this_local);
      yScale_00 = &stack0xffffffffffffff18;
      xScale_00 = &yScale;
      adjustRelCenter(bVar3,relY,&dy,&w,&ry,&rcx,xScale_00,yScale_00);
      uVar17 = (undefined4)((ulong)yScale_00 >> 0x20);
      iVar4 = SBarInfoCoordinate::operator*((SBarInfoCoordinate *)((long)&this_local + 4));
      local_249 = 0;
      if (iVar4 < 0) {
        bVar3 = SBarInfoCoordinate::RelCenter((SBarInfoCoordinate *)((long)&this_local + 4));
        local_249 = bVar3 ^ 0xff;
      }
      iVar4 = SBarInfoCoordinate::operator*((SBarInfoCoordinate *)&this_local);
      local_24b = 0;
      if (iVar4 < 0) {
        bVar3 = SBarInfoCoordinate::RelCenter((SBarInfoCoordinate *)&this_local);
        local_24b = bVar3 ^ 0xff;
      }
      if (forceWidth < 0) {
        local_258 = FTexture::GetScaledWidthDouble(_yOffset_local);
      }
      else {
        local_258 = (double)forceWidth;
      }
      h = local_258;
      if (forceHeight < 0) {
        local_260 = FTexture::GetScaledHeightDouble(_yOffset_local);
      }
      else {
        local_260 = (double)forceHeight;
      }
      tmp = local_260;
      bVar3 = FBoolCVar::operator_cast_to_bool(&vid_fps);
      if (((bVar3) && (ry < 0.0)) && (0.0 <= rcx)) {
        rcx = rcx + 10.0;
      }
      bVar3 = FBoolCVar::operator_cast_to_bool(&hud_scale);
      if (bVar3) {
        ry = yScale * ry;
        rcx = dStack_e8 * rcx;
        h = yScale * h;
        tmp = dStack_e8 * tmp;
      }
      if ((local_249 & 1) != 0) {
        iVar4 = DCanvas::GetWidth((DCanvas *)screen);
        ry = (double)iVar4 + ry;
      }
      if ((local_24b & 1) != 0) {
        iVar4 = DCanvas::GetHeight((DCanvas *)screen);
        rcx = (double)iVar4 + rcx;
      }
      local_268 = ry;
      if (((((*clip != 0.0) || (NAN(*clip))) ||
           ((clip[1] != 0.0 || ((NAN(clip[1]) || (clip[2] != 0.0)))))) || (NAN(clip[2]))) ||
         ((clip[3] != 0.0 || (NAN(clip[3]))))) {
        if ((*clip != 0.0) || (NAN(*clip))) {
          dVar10 = *clip;
          dVar11 = FTexture::GetScaledLeftOffsetDouble(_yOffset_local);
          local_268 = local_268 + (dVar10 - dVar11) * yScale;
        }
        else {
          local_268 = 0.0;
        }
        local_280 = rcx;
        rcy = local_268;
        if ((clip[1] != 0.0) || (NAN(clip[1]))) {
          dVar10 = clip[1];
          dVar11 = FTexture::GetScaledTopOffsetDouble(_yOffset_local);
          local_280 = local_280 + (dVar10 - dVar11) * dStack_e8;
        }
        else {
          local_280 = 0.0;
        }
        rcr = local_280;
        if ((clip[2] != 0.0) || (NAN(clip[2]))) {
          local_298 = ry + h;
          dVar10 = clip[2];
          dVar11 = FTexture::GetScaledLeftOffsetDouble(_yOffset_local);
          local_298 = local_298 - (dVar10 + dVar11) * yScale;
        }
        else {
          local_298 = 2147483647.0;
        }
        rcb = local_298;
        if ((clip[3] != 0.0) || (NAN(clip[3]))) {
          local_2b0 = rcx + tmp;
          dVar10 = clip[3];
          dVar11 = FTexture::GetScaledTopOffsetDouble(_yOffset_local);
          local_2b0 = local_2b0 - (dVar10 + dVar11) * dStack_e8;
        }
        else {
          local_2b0 = 2147483647.0;
        }
        xScale = local_2b0;
      }
      pFVar2 = _yOffset_local;
      dVar13 = h;
      dVar12 = tmp;
      dVar11 = ry;
      dVar10 = rcx;
      pDVar1 = screen;
      uVar16 = (undefined4)((ulong)xScale_00 >> 0x20);
      if ((dx._3_1_ & 1) == 0) {
        if ((dx._4_1_ & 1) == 0) {
          uVar5 = (uint)rcy;
          iVar4 = (int)rcr;
          iVar7 = (int)rcb;
          iVar8 = (int)xScale;
          if ((dx._6_1_ & 1) == 0) {
            local_368 = (FRemapTable *)0x0;
          }
          else {
            local_368 = GetTranslation(this);
          }
          uVar9 = 0;
          if ((dx._5_1_ & 1) != 0) {
            uVar9 = 0xaa000000;
          }
          DCanvas::DrawTexture
                    ((DCanvas *)pDVar1,pFVar2,dVar11,dVar10,0x400013af,dVar13,dVar12,dStack_58,
                     0x400013b0,0x400013a3,(ulong)uVar5,CONCAT44(uVar16,0x400013a1),
                     CONCAT44(uVar17,iVar4),0x400013a4,iVar7,0x400013a2,iVar8,0x4000138e,local_368,
                     0x400013aa,uVar9,0x4000139e,(uint)((offsetflags & 0x44U) == 0x44),0x4000138c,0)
          ;
        }
        else {
          uVar5 = (uint)rcy;
          iVar4 = (int)rcr;
          iVar7 = (int)rcb;
          iVar8 = (int)xScale;
          if ((dx._6_1_ & 1) == 0) {
            local_320 = (FRemapTable *)0x0;
          }
          else {
            local_320 = GetTranslation(this);
          }
          uVar9 = 0;
          if ((dx._5_1_ & 1) != 0) {
            uVar9 = 0xaa000000;
          }
          DCanvas::DrawTexture
                    ((DCanvas *)pDVar1,pFVar2,dVar11,dVar10,0x400013af,dVar13,dVar12,dStack_58,
                     0x400013b0,0x400013a3,(ulong)uVar5,CONCAT44(uVar16,0x400013a1),
                     CONCAT44(uVar17,iVar4),0x400013a4,iVar7,0x400013a2,iVar8,0x4000138e,local_320,
                     0x400013aa,uVar9,0x4000139e,(uint)((offsetflags & 0x44U) == 0x44),0x4000138c,
                     0x4000138f,(uint)(dx._4_1_ & 1),0x4000138d,0,0);
        }
      }
      else {
        uVar5 = (uint)rcy;
        uVar6 = (uint)rcr;
        dVar10 = MIN<double>(rcb,rcy + h);
        dVar11 = MIN<double>(xScale,rcr + tmp);
        (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                  (pDVar1,(ulong)uVar5,(ulong)uVar6,(ulong)(uint)(int)dVar10,
                   (ulong)(uint)(int)dVar11,(ulong)GPalette.BlackIndex,
                   (ulong)xScale_00 & 0xffffffff00000000);
      }
    }
  }
  return;
}

Assistant:

void DrawGraphic(FTexture* texture, SBarInfoCoordinate x, SBarInfoCoordinate y, int xOffset, int yOffset, double Alpha, bool fullScreenOffsets, bool translate=false, bool dim=false, int offsetflags=0, bool alphaMap=false, int forceWidth=-1, int forceHeight=-1, const double *clip = nulclip, bool clearDontDraw=false) const
	{
		if (texture == NULL)
			return;

		double dx = *x;
		double dy = *y;

		if((offsetflags & SBarInfoCommand::CENTER) == SBarInfoCommand::CENTER)
		{
			if (forceWidth < 0)	dx -= (texture->GetScaledWidthDouble()/2.0)-texture->GetScaledLeftOffsetDouble();
			else	dx -= forceWidth*(0.5-(texture->GetScaledLeftOffsetDouble()/texture->GetScaledWidthDouble()));
			//Unoptimalized formula is dx -= forceWidth/2.0-(texture->GetScaledLeftOffsetDouble()*forceWidth/texture->GetScaledWidthDouble());
			
			if (forceHeight < 0)	dy -= (texture->GetScaledHeightDouble()/2.0)-texture->GetScaledTopOffsetDouble();
			else	dy -= forceHeight*(0.5-(texture->GetScaledTopOffsetDouble()/texture->GetScaledHeightDouble()));
		}

		dx += xOffset;
		dy += yOffset;
		double w, h;
		if(!fullScreenOffsets)
		{
			double tmp = 0;
			dx += ST_X;
			dy += ST_Y - (Scaled ? script->resH : 200) + script->height;
			w = forceWidth < 0 ? texture->GetScaledWidthDouble() : forceWidth;
			h = forceHeight < 0 ? texture->GetScaledHeightDouble() : forceHeight;
			double dcx = clip[0] == 0 ? 0 : dx + clip[0] - texture->GetScaledLeftOffsetDouble();
			double dcy = clip[1] == 0 ? 0 : dy + clip[1] - texture->GetScaledTopOffsetDouble();
			double dcr = clip[2] == 0 ? INT_MAX : dx + w - clip[2] - texture->GetScaledLeftOffsetDouble();
			double dcb = clip[3] == 0 ? INT_MAX : dy + h - clip[3] - texture->GetScaledTopOffsetDouble();

			if(Scaled)
			{
				if(clip[0] != 0 || clip[1] != 0)
				{
					screen->VirtualToRealCoords(dcx, dcy, tmp, tmp, script->resW, script->resH, true);
					if (clip[0] == 0) dcx = 0;
					if (clip[1] == 0) dcy = 0;
				}
				if(clip[2] != 0 || clip[3] != 0 || clearDontDraw)
					screen->VirtualToRealCoords(dcr, dcb, tmp, tmp, script->resW, script->resH, true);
				screen->VirtualToRealCoords(dx, dy, w, h, script->resW, script->resH, true);
			}
			else
			{
				dy += 200 - script->resH;
				dcy += 200 - script->resH;
				dcb += 200 - script->resH;
			}

			if(clearDontDraw)
				screen->Clear(static_cast<int>(MAX<double>(dx, dcx)), static_cast<int>(MAX<double>(dy, dcy)), static_cast<int>(MIN<double>(dcr,w+MAX<double>(dx, dcx))), static_cast<int>(MIN<double>(dcb,MAX<double>(dy, dcy)+h)), GPalette.BlackIndex, 0);
			else
			{
				if(alphaMap)
				{
					screen->DrawTexture(texture, dx, dy,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(dcx),
						DTA_ClipTop, static_cast<int>(dcy),
						DTA_ClipRight, static_cast<int>(MIN<double>(INT_MAX, dcr)),
						DTA_ClipBottom, static_cast<int>(MIN<double>(INT_MAX, dcb)),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						DTA_AlphaChannel, alphaMap,
						DTA_FillColor, 0,
						TAG_DONE);
				}
				else
				{
					screen->DrawTexture(texture, dx, dy,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(dcx),
						DTA_ClipTop, static_cast<int>(dcy),
						DTA_ClipRight, static_cast<int>(MIN<double>(INT_MAX, dcr)),
						DTA_ClipBottom, static_cast<int>(MIN<double>(INT_MAX, dcb)),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						TAG_DONE);
				}
			}
		}
		else
		{
			double rx, ry, rcx=0, rcy=0, rcr=INT_MAX, rcb=INT_MAX;

			double xScale = !hud_scale ? 1 : script->cleanX;
			double yScale = !hud_scale ? 1 : script->cleanY;

			adjustRelCenter(x.RelCenter(), y.RelCenter(), dx, dy, rx, ry, xScale, yScale);

			// We can't use DTA_HUDRules since it forces a width and height.
			// Translation: No high res.
			bool xright = *x < 0 && !x.RelCenter();
			bool ybot = *y < 0 && !y.RelCenter();

			w = (forceWidth < 0 ? texture->GetScaledWidthDouble() : forceWidth);
			h = (forceHeight < 0 ? texture->GetScaledHeightDouble() : forceHeight);
			if(vid_fps && rx < 0 && ry >= 0)
				ry += 10;
			if(hud_scale)
			{
				rx *= xScale;
				ry *= yScale;
				w *= xScale;
				h *= yScale;
			}
			if(xright)
				rx = SCREENWIDTH + rx;
			if(ybot)
				ry = SCREENHEIGHT + ry;

			// Check for clipping
			if(clip[0] != 0 || clip[1] != 0 || clip[2] != 0 || clip[3] != 0)
			{
				rcx = clip[0] == 0 ? 0 : rx+((clip[0] - texture->GetScaledLeftOffsetDouble())*xScale);
				rcy = clip[1] == 0 ? 0 : ry+((clip[1] - texture->GetScaledTopOffsetDouble())*yScale);
				rcr = clip[2] == 0 ? INT_MAX : rx+w-((clip[2] + texture->GetScaledLeftOffsetDouble())*xScale);
				rcb = clip[3] == 0 ? INT_MAX : ry+h-((clip[3] + texture->GetScaledTopOffsetDouble())*yScale);
			}

			if(clearDontDraw)
				screen->Clear(static_cast<int>(rcx), static_cast<int>(rcy), static_cast<int>(MIN<double>(rcr, rcx+w)), static_cast<int>(MIN<double>(rcb, rcy+h)), GPalette.BlackIndex, 0);
			else
			{
				if(alphaMap)
				{
					screen->DrawTexture(texture, rx, ry,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(rcx),
						DTA_ClipTop, static_cast<int>(rcy),
						DTA_ClipRight, static_cast<int>(rcr),
						DTA_ClipBottom, static_cast<int>(rcb),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						DTA_AlphaChannel, alphaMap,
						DTA_FillColor, 0,
						TAG_DONE);
				}
				else
				{
					screen->DrawTexture(texture, rx, ry,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(rcx),
						DTA_ClipTop, static_cast<int>(rcy),
						DTA_ClipRight, static_cast<int>(rcr),
						DTA_ClipBottom, static_cast<int>(rcb),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						TAG_DONE);
				}
			}
		}
	}